

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcDivide.c
# Opt level: O0

void Mvc_CoverDivideByCube
               (Mvc_Cover_t *pCover,Mvc_Cover_t *pDiv,Mvc_Cover_t **ppQuo,Mvc_Cover_t **ppRem)

{
  int iVar1;
  Mvc_Cover_t *pCover_00;
  Mvc_Cover_t *pCover_01;
  Mvc_Cube_t *pMVar2;
  Mvc_Cube_t *pMVar3;
  bool bVar4;
  Mvc_List_t *pList_1;
  Mvc_List_t *pList;
  int _i_;
  int CompResult;
  Mvc_Cube_t *pCubeCopy;
  Mvc_Cube_t *pCubeD;
  Mvc_Cube_t *pCubeC;
  Mvc_Cover_t *pRem;
  Mvc_Cover_t *pQuo;
  Mvc_Cover_t **ppRem_local;
  Mvc_Cover_t **ppQuo_local;
  Mvc_Cover_t *pDiv_local;
  Mvc_Cover_t *pCover_local;
  
  iVar1 = Mvc_CoverReadCubeNum(pDiv);
  if (iVar1 != 1) {
    __assert_fail("Mvc_CoverReadCubeNum(pDiv) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/mvc/mvcDivide.c"
                  ,0x114,
                  "void Mvc_CoverDivideByCube(Mvc_Cover_t *, Mvc_Cover_t *, Mvc_Cover_t **, Mvc_Cover_t **)"
                 );
  }
  pCover_00 = Mvc_CoverAlloc(pCover->pMem,pCover->nBits);
  pCover_01 = Mvc_CoverAlloc(pCover->pMem,pCover->nBits);
  pMVar2 = Mvc_CoverReadCubeHead(pDiv);
  for (pCubeD = (pCover->lCubes).pHead; pCubeD != (Mvc_Cube_t *)0x0; pCubeD = pCubeD->pNext) {
    bVar4 = true;
    if ((pMVar2->pData[0] & (pCubeD->pData[0] ^ 0xffffffff)) == 0) {
      bVar4 = (*(uint *)&pMVar2->field_0x14 & (*(uint *)&pCubeD->field_0x14 ^ 0xffffffff)) != 0;
    }
    if (bVar4) {
      pMVar3 = Mvc_CubeDup(pCover_01,pCubeD);
      if ((pCover_01->lCubes).pHead == (Mvc_Cube_t *)0x0) {
        (pCover_01->lCubes).pHead = pMVar3;
      }
      else {
        ((pCover_01->lCubes).pTail)->pNext = pMVar3;
      }
      (pCover_01->lCubes).pTail = pMVar3;
      pMVar3->pNext = (Mvc_Cube_t *)0x0;
      (pCover_01->lCubes).nItems = (pCover_01->lCubes).nItems + 1;
    }
    else {
      pMVar3 = Mvc_CubeAlloc(pCover_00);
      if ((*(uint *)&pCubeD->field_0x8 & 0xffffff) == 0) {
        pMVar3->pData[0] = pCubeD->pData[0] & (pMVar2->pData[0] ^ 0xffffffff);
      }
      else if ((*(uint *)&pCubeD->field_0x8 & 0xffffff) == 1) {
        pMVar3->pData[0] = pCubeD->pData[0] & (pMVar2->pData[0] ^ 0xffffffff);
        *(uint *)&pMVar3->field_0x14 =
             *(uint *)&pCubeD->field_0x14 & (*(uint *)&pMVar2->field_0x14 ^ 0xffffffff);
      }
      else {
        for (pList._0_4_ = *(uint *)&pCubeD->field_0x8 & 0xffffff; -1 < (int)(uint)pList;
            pList._0_4_ = (uint)pList - 1) {
          pMVar3->pData[(int)(uint)pList] =
               pCubeD->pData[(int)(uint)pList] & (pMVar2->pData[(int)(uint)pList] ^ 0xffffffff);
        }
      }
      if ((pCover_00->lCubes).pHead == (Mvc_Cube_t *)0x0) {
        (pCover_00->lCubes).pHead = pMVar3;
      }
      else {
        ((pCover_00->lCubes).pTail)->pNext = pMVar3;
      }
      (pCover_00->lCubes).pTail = pMVar3;
      pMVar3->pNext = (Mvc_Cube_t *)0x0;
      (pCover_00->lCubes).nItems = (pCover_00->lCubes).nItems + 1;
    }
  }
  *ppRem = pCover_01;
  *ppQuo = pCover_00;
  return;
}

Assistant:

void Mvc_CoverDivideByCube( Mvc_Cover_t * pCover, Mvc_Cover_t * pDiv, Mvc_Cover_t ** ppQuo, Mvc_Cover_t ** ppRem )
{
    Mvc_Cover_t * pQuo, * pRem;
    Mvc_Cube_t * pCubeC, * pCubeD, * pCubeCopy;
    int CompResult;

    // get the only cube of D
    assert( Mvc_CoverReadCubeNum(pDiv) == 1 );

    // start the quotient and the remainder
    pQuo = Mvc_CoverAlloc( pCover->pMem, pCover->nBits );
    pRem = Mvc_CoverAlloc( pCover->pMem, pCover->nBits );

    // get the first and only cube of the divisor
    pCubeD = Mvc_CoverReadCubeHead( pDiv );

    // iterate through the cubes in the cover
    Mvc_CoverForEachCube( pCover, pCubeC )
    {
        // check the containment of literals from pCubeD in pCube
        Mvc_Cube2BitNotImpl( CompResult, pCubeD, pCubeC );
        if ( !CompResult )
        { // this cube belongs to the quotient
            // alloc the cube
            pCubeCopy = Mvc_CubeAlloc( pQuo );
            // clean the support of D
            Mvc_CubeBitSharp( pCubeCopy, pCubeC, pCubeD );
            // add the cube to the quotient
            Mvc_CoverAddCubeTail( pQuo, pCubeCopy );
        }
        else
        { 
            // copy the cube
            pCubeCopy = Mvc_CubeDup( pRem, pCubeC );
            // add the cube to the remainder
            Mvc_CoverAddCubeTail( pRem, pCubeCopy );
        }
    }
    // return the results
    *ppRem = pRem;
    *ppQuo = pQuo;
}